

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall
QFileSystemModelPrivate::removeNode
          (QFileSystemModelPrivate *this,QFileSystemNode *parentNode,QString *name)

{
  QModelIndex *pQVar1;
  bool bVar2;
  uint row;
  int iVar3;
  QFileSystemNode *this_00;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QModelIndex **)&this->field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  index((QFileSystemModelPrivate *)local_58,(char *)this,(int)parentNode);
  bVar2 = isHiddenByFilter(this,parentNode,(QModelIndex *)local_58);
  row = QFileSystemNode::visibleLocation(parentNode,name);
  if (-1 < (int)row && !bVar2) {
    iVar3 = translateVisibleLocation(this,parentNode,row);
    translateVisibleLocation(this,parentNode,row);
    QAbstractItemModel::beginRemoveRows(pQVar1,(int)local_58,iVar3);
  }
  this_00 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::takeImpl<QString>
                      (&parentNode->children,name);
  if (this_00 != (QFileSystemNode *)0x0) {
    QFileSystemNode::~QFileSystemNode(this_00);
  }
  operator_delete(this_00,0x50);
  if (-1 < (int)row) {
    QList<QString>::removeAt(&parentNode->visibleChildren,(ulong)row);
    if (!bVar2) {
      QAbstractItemModel::endRemoveRows();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::removeNode(QFileSystemModelPrivate::QFileSystemNode *parentNode, const QString& name)
{
    Q_Q(QFileSystemModel);
    QModelIndex parent = index(parentNode);
    bool indexHidden = isHiddenByFilter(parentNode, parent);

    int vLocation = parentNode->visibleLocation(name);
    if (vLocation >= 0 && !indexHidden)
        q->beginRemoveRows(parent, translateVisibleLocation(parentNode, vLocation),
                                       translateVisibleLocation(parentNode, vLocation));
    QFileSystemNode * node = parentNode->children.take(name);
    delete node;
    // cleanup sort files after removing rather then re-sorting which is O(n)
    if (vLocation >= 0)
        parentNode->visibleChildren.removeAt(vLocation);
    if (vLocation >= 0 && !indexHidden)
        q->endRemoveRows();
}